

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_helpers.cc
# Opt level: O1

bool google::protobuf::compiler::csharp::IsNullable(FieldDescriptor *descriptor)

{
  Nonnull<const_char_*> pcVar1;
  bool v1;
  byte bVar2;
  LogMessage LStack_18;
  
  bVar2 = descriptor->field_0x1;
  v1 = (bool)((bVar2 & 0x20) >> 5);
  if (0xbf < bVar2 == v1) {
    pcVar1 = (Nonnull<const_char_*>)0x0;
  }
  else {
    pcVar1 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                       (v1,0xbf < bVar2,
                        "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
  }
  if (pcVar1 == (Nonnull<const_char_*>)0x0) {
    bVar2 = 1;
    if ((descriptor->field_0x1 & 0x20) == 0) {
      bVar2 = descriptor->type_ - 1;
      if (0x11 < bVar2) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&LStack_18,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/csharp/csharp_helpers.cc"
                   ,0x1b2);
        absl::lts_20250127::log_internal::LogMessage::operator<<
                  (&LStack_18,(char (*) [20])"Unknown field type.");
        goto LAB_00e1bf86;
      }
      bVar2 = (byte)(0xf00 >> (bVar2 & 0x1f));
    }
    return (bool)(bVar2 & 1);
  }
  IsNullable();
LAB_00e1bf86:
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&LStack_18)
  ;
}

Assistant:

bool IsNullable(const FieldDescriptor* descriptor) {
  if (descriptor->is_repeated()) {
    return true;
  }

  switch (descriptor->type()) {
    case FieldDescriptor::TYPE_ENUM:
    case FieldDescriptor::TYPE_DOUBLE:
    case FieldDescriptor::TYPE_FLOAT:
    case FieldDescriptor::TYPE_INT64:
    case FieldDescriptor::TYPE_UINT64:
    case FieldDescriptor::TYPE_INT32:
    case FieldDescriptor::TYPE_FIXED64:
    case FieldDescriptor::TYPE_FIXED32:
    case FieldDescriptor::TYPE_BOOL:
    case FieldDescriptor::TYPE_UINT32:
    case FieldDescriptor::TYPE_SFIXED32:
    case FieldDescriptor::TYPE_SFIXED64:
    case FieldDescriptor::TYPE_SINT32:
    case FieldDescriptor::TYPE_SINT64:
      return false;

    case FieldDescriptor::TYPE_MESSAGE:
    case FieldDescriptor::TYPE_GROUP:
    case FieldDescriptor::TYPE_STRING:
    case FieldDescriptor::TYPE_BYTES:
      return true;

    default:
      ABSL_LOG(FATAL) << "Unknown field type.";
      return true;
  }
}